

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgList<unsigned_int> * __thiscall
cimg_library::CImgList<unsigned_int>::insert
          (CImgList<unsigned_int> *this,CImg<unsigned_int> *img,uint pos,bool is_shared)

{
  undefined8 *puVar1;
  CImg<unsigned_int> *pCVar2;
  void *pvVar3;
  ulong *puVar4;
  CImgArgumentException *this_00;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  CImg<unsigned_int> *pCVar10;
  uint size_z;
  uint size_c;
  ulong uVar11;
  
  uVar7 = this->_width;
  if (pos == 0xffffffff) {
    pos = uVar7;
  }
  uVar11 = (ulong)pos;
  if (uVar7 < pos) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned int",
               (ulong)img->_width,(ulong)img->_height,(ulong)img->_depth,(ulong)img->_spectrum,
               img->_data,uVar11);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  this->_width = uVar7 + 1;
  uVar5 = this->_allocated_width;
  if (uVar5 < uVar7 + 1) {
    uVar8 = 0x10;
    if (uVar5 != 0) {
      uVar8 = (ulong)(uVar5 * 2);
    }
    this->_allocated_width = (uint)uVar8;
    puVar4 = (ulong *)operator_new__(uVar8 * 0x20 + 8);
    *puVar4 = uVar8;
    pCVar10 = (CImg<unsigned_int> *)(puVar4 + 1);
    if ((uint)uVar8 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar6 + 0x20) = 0;
        puVar1 = (undefined8 *)((long)puVar4 + lVar6 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)puVar4 + lVar6 + 0x18) = 0;
        lVar6 = lVar6 + 0x20;
      } while (uVar8 * 0x20 != lVar6);
    }
  }
  else {
    pCVar10 = (CImg<unsigned_int> *)0x0;
  }
  pCVar2 = this->_data;
  if (pCVar2 == (CImg<unsigned_int> *)0x0) {
    this->_data = pCVar10;
    if ((is_shared) && (puVar9 = img->_data, puVar9 != (uint *)0x0)) {
      pCVar10->_width = img->_width;
      pCVar10->_height = img->_height;
      pCVar10->_depth = img->_depth;
      pCVar10->_spectrum = img->_spectrum;
      pCVar10->_is_shared = true;
      pCVar10->_data = puVar9;
      return this;
    }
    puVar9 = img->_data;
    uVar7 = img->_width;
    uVar5 = img->_height;
    size_z = img->_depth;
    size_c = img->_spectrum;
  }
  else {
    if (pCVar10 != (CImg<unsigned_int> *)0x0) {
      uVar11 = (ulong)pos;
      if (pos != 0) {
        memcpy(pCVar10,pCVar2,uVar11 << 5);
      }
      if (uVar7 - pos != 0) {
        memcpy(pCVar10 + uVar11 + 1,pCVar2 + uVar11,(ulong)(uVar7 - pos) << 5);
      }
      if ((is_shared) && (puVar9 = img->_data, puVar9 != (uint *)0x0)) {
        pCVar10[uVar11]._width = img->_width;
        pCVar10[uVar11]._height = img->_height;
        pCVar10[uVar11]._depth = img->_depth;
        pCVar10[uVar11]._spectrum = img->_spectrum;
        pCVar10[uVar11]._is_shared = true;
        pCVar10[uVar11]._data = puVar9;
      }
      else {
        pCVar10[uVar11]._data = (uint *)0x0;
        pCVar2 = pCVar10 + uVar11;
        pCVar2->_width = 0;
        pCVar2->_height = 0;
        pCVar2->_depth = 0;
        pCVar2->_spectrum = 0;
        CImg<unsigned_int>::assign
                  (pCVar10 + uVar11,img->_data,img->_width,img->_height,img->_depth,img->_spectrum);
      }
      memset(this->_data,0,(ulong)(this->_width - 1) << 5);
      pCVar2 = this->_data;
      if (pCVar2 != (CImg<unsigned_int> *)0x0) {
        if (pCVar2[-1]._data != (uint *)0x0) {
          lVar6 = (long)pCVar2[-1]._data << 5;
          do {
            if ((*(char *)((long)pCVar2 + lVar6 + -0x10) == '\0') &&
               (pvVar3 = *(void **)((long)&pCVar2[-1]._data + lVar6), pvVar3 != (void *)0x0)) {
              operator_delete__(pvVar3);
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pCVar2[-1]._data);
      }
      this->_data = pCVar10;
      return this;
    }
    if (uVar7 - pos != 0) {
      memmove(pCVar2 + uVar11 + 1,pCVar2 + uVar11,(ulong)(uVar7 - pos) << 5);
    }
    if ((is_shared) && (puVar9 = img->_data, puVar9 != (uint *)0x0)) {
      pCVar10 = this->_data;
      pCVar10[uVar11]._width = img->_width;
      pCVar10[uVar11]._height = img->_height;
      pCVar10[uVar11]._depth = img->_depth;
      pCVar10[uVar11]._spectrum = img->_spectrum;
      pCVar10[uVar11]._is_shared = true;
      pCVar10[uVar11]._data = puVar9;
      return this;
    }
    pCVar2 = this->_data;
    pCVar10 = pCVar2 + pos;
    pCVar2[pos]._data = (uint *)0x0;
    pCVar2 = pCVar2 + pos;
    pCVar2->_width = 0;
    pCVar2->_height = 0;
    pCVar2->_depth = 0;
    pCVar2->_spectrum = 0;
    puVar9 = img->_data;
    uVar7 = img->_width;
    uVar5 = img->_height;
    size_z = img->_depth;
    size_c = img->_spectrum;
  }
  CImg<unsigned_int>::assign(pCVar10,puVar9,uVar7,uVar5,size_z,size_c);
  return this;
}

Assistant:

CImgList<T>& insert(const CImg<T>& img, const unsigned int pos=~0U, const bool is_shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if (npos>_width)
        throw CImgArgumentException(_cimglist_instance
                                    "insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) "
                                    "at position %u.",
                                    cimglist_instance,
                                    img._width,img._height,img._depth,img._spectrum,img._data,npos);
      CImg<T> *const new_data = (++_width>_allocated_width)?new CImg<T>[_allocated_width?(_allocated_width<<=1):
                                                                        (_allocated_width=16)]:0;
      if (!_data) { // Insert new element into empty list
        _data = new_data;
        if (is_shared && img) {
          _data->_width = img._width;
          _data->_height = img._height;
          _data->_depth = img._depth;
          _data->_spectrum = img._spectrum;
          _data->_is_shared = true;
          _data->_data = img._data;
        } else *_data = img;
      }
      else {
        if (new_data) { // Insert with re-allocation
          if (npos) std::memcpy((void*)new_data,(void*)_data,sizeof(CImg<T>)*npos);
          if (npos!=_width - 1)
            std::memcpy((void*)(new_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            new_data[npos]._width = img._width;
            new_data[npos]._height = img._height;
            new_data[npos]._depth = img._depth;
            new_data[npos]._spectrum = img._spectrum;
            new_data[npos]._is_shared = true;
            new_data[npos]._data = img._data;
          } else {
            new_data[npos]._width = new_data[npos]._height = new_data[npos]._depth = new_data[npos]._spectrum = 0;
            new_data[npos]._data = 0;
            new_data[npos] = img;
          }
          std::memset((void*)_data,0,sizeof(CImg<T>)*(_width - 1));
          delete[] _data;
          _data = new_data;
        } else { // Insert without re-allocation
          if (npos!=_width - 1)
            std::memmove((void*)(_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            _data[npos]._width = img._width;
            _data[npos]._height = img._height;
            _data[npos]._depth = img._depth;
            _data[npos]._spectrum = img._spectrum;
            _data[npos]._is_shared = true;
            _data[npos]._data = img._data;
          } else {
            _data[npos]._width = _data[npos]._height = _data[npos]._depth = _data[npos]._spectrum = 0;
            _data[npos]._data = 0;
            _data[npos] = img;
          }
        }
      }
      return *this;
    }